

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetRenderDeviceTypeShortString(RENDER_DEVICE_TYPE DeviceType,bool Capital)

{
  Char *Message;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 local_38 [8];
  string msg;
  bool Capital_local;
  char *pcStack_10;
  RENDER_DEVICE_TYPE DeviceType_local;
  
  switch(DeviceType) {
  case RENDER_DEVICE_TYPE_UNDEFINED:
    if (Capital) {
      local_58 = "UNDEFINED";
    }
    else {
      local_58 = "undefined";
    }
    pcStack_10 = local_58;
    break;
  case RENDER_DEVICE_TYPE_D3D11:
    if (Capital) {
      local_60 = "D3D11";
    }
    else {
      local_60 = "d3d11";
    }
    pcStack_10 = local_60;
    break;
  case RENDER_DEVICE_TYPE_D3D12:
    if (Capital) {
      local_68 = "D3D12";
    }
    else {
      local_68 = "d3d12";
    }
    pcStack_10 = local_68;
    break;
  case RENDER_DEVICE_TYPE_GL:
    if (Capital) {
      local_70 = "GL";
    }
    else {
      local_70 = "gl";
    }
    pcStack_10 = local_70;
    break;
  case RENDER_DEVICE_TYPE_GLES:
    if (Capital) {
      local_78 = "GLES";
    }
    else {
      local_78 = "gles";
    }
    pcStack_10 = local_78;
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    if (Capital) {
      local_80 = "VK";
    }
    else {
      local_80 = "vk";
    }
    pcStack_10 = local_80;
    break;
  case RENDER_DEVICE_TYPE_METAL:
    if (Capital) {
      local_88 = "MTL";
    }
    else {
      local_88 = "mtl";
    }
    pcStack_10 = local_88;
    break;
  case RENDER_DEVICE_TYPE_WEBGPU:
    if (Capital) {
      local_90 = "WGPU";
    }
    else {
      local_90 = "wgpu";
    }
    pcStack_10 = local_90;
    break;
  default:
    msg.field_2._M_local_buf[0xb] = Capital;
    msg.field_2._12_4_ = DeviceType;
    FormatString<char[32]>((string *)local_38,(char (*) [32])"Unknown/unsupported device type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetRenderDeviceTypeShortString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x649);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetRenderDeviceTypeShortString(RENDER_DEVICE_TYPE DeviceType, bool Capital)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Did you add a new device type? Please update the switch below.");
    switch (DeviceType)
    {
        // clang-format off
        case RENDER_DEVICE_TYPE_UNDEFINED: return Capital ? "UNDEFINED" : "undefined"; break;
        case RENDER_DEVICE_TYPE_D3D11:     return Capital ? "D3D11"     : "d3d11";     break;
        case RENDER_DEVICE_TYPE_D3D12:     return Capital ? "D3D12"     : "d3d12";     break;
        case RENDER_DEVICE_TYPE_GL:        return Capital ? "GL"        : "gl";        break;
        case RENDER_DEVICE_TYPE_GLES:      return Capital ? "GLES"      : "gles";      break;
        case RENDER_DEVICE_TYPE_VULKAN:    return Capital ? "VK"        : "vk";        break;
        case RENDER_DEVICE_TYPE_METAL:     return Capital ? "MTL"       : "mtl";       break;
        case RENDER_DEVICE_TYPE_WEBGPU:    return Capital ? "WGPU"      : "wgpu";      break;
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported device type"); return "UNKNOWN";
    }
}